

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitCommon.c
# Opt level: O0

void sysbvm_bytecodeJit_initialize(sysbvm_bytecodeJit_t *jit,sysbvm_context_t *context)

{
  sysbvm_context_t *context_local;
  sysbvm_bytecodeJit_t *jit_local;
  
  memset(jit,0,0x438);
  jit->context = context;
  sysbvm_dynarray_initialize(&jit->instructions,1,0x400);
  sysbvm_dynarray_initialize(&jit->constants,1,0x400);
  sysbvm_dynarray_initialize(&jit->relocations,0x20,0);
  sysbvm_dynarray_initialize(&jit->pcRelocations,0x18,0);
  sysbvm_dynarray_initialize(&jit->sourcePositions,0x18,0x100);
  sysbvm_dynarray_initialize(&jit->unwindInfo,1,0x40);
  sysbvm_dynarray_initialize(&jit->unwindInfoBytecode,1,0x40);
  sysbvm_dwarf_cfi_create(&jit->dwarfEhBuilder);
  sysbvm_dwarf_debugInfo_create(&jit->dwarfDebugInfoBuilder);
  sysbvm_dynarray_initialize(&jit->objectFileHeader,1,0x40);
  sysbvm_dynarray_initialize(&jit->objectFileContent,1,0x400);
  return;
}

Assistant:

SYSBVM_API void sysbvm_bytecodeJit_initialize(sysbvm_bytecodeJit_t *jit, sysbvm_context_t *context)
{
    memset(jit, 0, sizeof(sysbvm_bytecodeJit_t));
    jit->context = context;
    sysbvm_dynarray_initialize(&jit->instructions, 1, 1024);
    sysbvm_dynarray_initialize(&jit->constants, 1, 1024);
    sysbvm_dynarray_initialize(&jit->relocations, sizeof(sysbvm_bytecodeJitRelocation_t), 0);
    sysbvm_dynarray_initialize(&jit->pcRelocations, sizeof(sysbvm_bytecodeJitPCRelocation_t), 0);
    sysbvm_dynarray_initialize(&jit->sourcePositions, sizeof(sysbvm_bytecodeJitSourcePositionRecord_t), 256);

    sysbvm_dynarray_initialize(&jit->unwindInfo, 1, 64);
    sysbvm_dynarray_initialize(&jit->unwindInfoBytecode, 1, 64);

    sysbvm_dwarf_cfi_create(&jit->dwarfEhBuilder);
    sysbvm_dwarf_debugInfo_create(&jit->dwarfDebugInfoBuilder);
    sysbvm_dynarray_initialize(&jit->objectFileHeader, 1, sizeof(sysbvm_elf64_header_t));
    sysbvm_dynarray_initialize(&jit->objectFileContent, 1, 1024);
}